

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::computeResWithCrseSolFineCor(MLMG *this,int calev,int falev)

{
  int *piVar1;
  Any *pAVar2;
  Any *pAVar3;
  Any *pAVar4;
  Any *pAVar5;
  Any *pAVar6;
  Any *pAVar7;
  Any *pAVar8;
  Any *pAVar9;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  Any *crse_bcdata;
  Any *fine_rescor;
  Any *fine_res;
  Any *fine_cor;
  Any *fine_rhs;
  Any *fine_sol;
  Any *crse_res;
  Any *crse_rhs;
  Any *crse_sol;
  IntVect nghost;
  size_type in_stack_ffffffffffffff68;
  uint uVar10;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_ffffffffffffff70;
  Any *local_88;
  int local_30;
  int local_2c;
  IntVect local_28;
  IntVect local_1c;
  undefined4 local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  IntVect::IntVect(&local_1c,0);
  if (*(int *)(in_RDI + 0x24) == 1) {
    local_2c = (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))
                         (*(long **)(in_RDI + 0x48),local_10,0);
    local_30 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x30))(*(long **)(in_RDI + 0x48),local_c,0)
    ;
    piVar1 = std::min<int>(&local_2c,&local_30);
    IntVect::IntVect(&local_28,*piVar1);
    local_1c.vect[0] = local_28.vect[0];
    local_1c.vect[1] = local_28.vect[1];
    local_1c.vect[2] = local_28.vect[2];
  }
  pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar4 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar5 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar6 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar7 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar8 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pAVar9 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (local_c < 1) {
    local_88 = (Any *)0x0;
  }
  else {
    local_88 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  uVar10 = (uint)(in_stack_ffffffffffffff68 >> 0x20);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1a0))
            (*(long **)(in_RDI + 0x48),local_c,pAVar4,pAVar2,pAVar3,local_88);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1a8))
            (*(long **)(in_RDI + 0x48),local_10,0,pAVar9,pAVar7,pAVar8,(ulong)uVar10 << 0x20,0);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x160))
            (*(long **)(in_RDI + 0x48),pAVar8,pAVar9,&local_1c);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1b0))
            (*(long **)(in_RDI + 0x48),local_c,pAVar4,pAVar2,pAVar3,pAVar8,pAVar5,pAVar6);
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1b8))(*(long **)(in_RDI + 0x48),local_c,pAVar4,pAVar8)
  ;
  return;
}

Assistant:

void
MLMG::computeResWithCrseSolFineCor (int calev, int falev)
{
    BL_PROFILE("MLMG::computeResWithCrseSolFineCor()");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(std::min(linop.getNGrow(falev),linop.getNGrow(calev)));

    Any&       crse_sol = sol[calev];
    const Any& crse_rhs = rhs[calev];
    Any&       crse_res = res[calev][0];

    Any&       fine_sol = sol[falev];
    const Any& fine_rhs = rhs[falev];
    Any&       fine_cor = cor[falev][0];
    Any&       fine_res = res[falev][0];
    Any&    fine_rescor = rescor[falev][0];

    const Any* crse_bcdata = (calev > 0) ? &(sol[calev-1]) : nullptr;
    linop.AnySolutionResidual(calev, crse_res, crse_sol, crse_rhs, crse_bcdata);

    linop.AnyCorrectionResidual(falev, 0, fine_rescor, fine_cor, fine_res, BCMode::Homogeneous);
    linop.AnyCopy(fine_res, fine_rescor, nghost);

    linop.AnyReflux(calev, crse_res, crse_sol, crse_rhs, fine_res, fine_sol, fine_rhs);

    linop.AnyAvgDownResAmr(calev, crse_res, fine_res);
}